

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String __thiscall Bstrlib::String::alignedTo(String *this,int length,int side,char fill)

{
  undefined3 in_register_00000009;
  int iVar1;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  undefined4 in_register_00000034;
  String *b;
  uchar in_R8B;
  int iVar3;
  int length_00;
  String SVar4;
  String a;
  String a_1;
  tagbstring local_78;
  tagbstring local_68;
  String local_58;
  String *local_48;
  String local_40;
  uchar *puVar2;
  
  b = (String *)CONCAT44(in_register_00000034,length);
  iVar1 = CONCAT31(in_register_00000009,fill);
  iVar3 = (b->super_tagbstring).slen;
  length_00 = side - iVar3;
  if (side < iVar3) {
    String(this,b);
    puVar2 = extraout_RDX;
    goto LAB_001128c8;
  }
  if (iVar1 == -1) {
    iVar3 = 0;
  }
  else {
    iVar3 = length_00;
    if (iVar1 != 1) {
      if (iVar1 == 0) {
        iVar3 = length_00 / 2;
        length_00 = (length_00 - (length_00 + 1 >> 0x1f)) + 1 >> 1;
        goto LAB_001127f4;
      }
      iVar3 = 0;
    }
    length_00 = 0;
  }
LAB_001127f4:
  local_48 = this;
  String(&local_40);
  String((String *)&local_78,&local_40);
  Fill((String *)&local_78,iVar3,in_R8B);
  operator+((String *)&local_68,(String *)&local_78);
  this = local_48;
  String(&local_58,b);
  Fill(&local_58,length_00,in_R8B);
  SVar4 = operator+(this,(String *)&local_68);
  puVar2 = SVar4.super_tagbstring.data;
  if (local_58.super_tagbstring.data != (uchar *)0x0) {
    free(local_58.super_tagbstring.data);
    puVar2 = extraout_RDX_00;
  }
  if (local_68.data != (uchar *)0x0) {
    free(local_68.data);
    local_68.data = (uchar *)0x0;
    puVar2 = extraout_RDX_01;
  }
  local_68.mlen = 0;
  local_68.slen = -0xe0;
  if (local_78.data != (uchar *)0x0) {
    free(local_78.data);
    local_78.data = (uchar *)0x0;
    puVar2 = extraout_RDX_02;
  }
  local_78.mlen = 0;
  local_78.slen = -0xe0;
  if (local_40.super_tagbstring.data != (uchar *)0x0) {
    free(local_40.super_tagbstring.data);
    puVar2 = extraout_RDX_03;
  }
LAB_001128c8:
  SVar4.super_tagbstring.data = puVar2;
  SVar4.super_tagbstring._0_8_ = this;
  return (String)SVar4.super_tagbstring;
}

Assistant:

String String::alignedTo(const int length, int side, char fill) const
    {
        if (slen > length) return *this;
        int diffInSize = (length - slen),
            leftCount = side == 1 ? diffInSize : (side == 0 ? diffInSize / 2 : 0),
            rightCount = side == -1 ? diffInSize : (side == 0 ? (diffInSize + 1) / 2 : 0);

        return String().Filled(leftCount, fill) + *this + Filled(rightCount, fill);
    }